

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::GetTargetFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *name,string *config)

{
  pointer pcVar1;
  int iVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string path;
  _Alloc_hider local_a8;
  size_type local_a0;
  char local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  string local_88;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  char *local_40;
  char local_38 [32];
  
  (*(this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[4])(&local_a8,this,config);
  if (local_a0 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_a8);
    if (iVar2 != 0) {
      local_68._M_str = local_38;
      local_48 = 1;
      local_38[0] = '/';
      local_50 = (name->_M_dataplus)._M_p;
      local_58 = name->_M_string_length;
      local_68._M_len = 1;
      views._M_len = 2;
      views._M_array = &local_68;
      local_40 = local_68._M_str;
      cmCatViews_abi_cxx11_(&local_88,views);
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_a8._M_p == &local_98) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_97,local_98);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_90;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_a8._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_97,local_98);
      }
      __return_storage_ptr__->_M_string_length = local_a0;
      local_a0 = 0;
      local_98 = '\0';
      local_a8._M_p = &local_98;
      goto LAB_0040411c;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
LAB_0040411c:
  if (local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,CONCAT71(uStack_97,local_98) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetFilePath(
  const std::string& name, const std::string& config) const
{
  std::string path = this->GetTargetOutputDir(config);
  if (path.empty() || path == ".") {
    return name;
  }
  path += cmStrCat('/', name);
  return path;
}